

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

void __thiscall Json::StyledStreamWriter::writeValue(StyledStreamWriter *this,Value *value)

{
  pointer pbVar1;
  bool bVar2;
  ValueType VVar3;
  Json *pJVar4;
  Value *pVVar5;
  char *value_00;
  LargestUInt value_01;
  char *value_02;
  LargestInt value_03;
  char *pcVar6;
  pointer key;
  double value_04;
  Members members;
  string local_68;
  Members local_48;
  
  pVVar5 = value;
  VVar3 = Value::type(value);
  switch(VVar3) {
  case nullValue:
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"null","");
    pushValue(this,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return;
    }
    goto LAB_0014ddce;
  case intValue:
    pJVar4 = (Json *)Value::asLargestInt(value);
    valueToString_abi_cxx11_(&local_68,pJVar4,value_03);
    pushValue(this,&local_68);
    break;
  case uintValue:
    pJVar4 = (Json *)Value::asLargestUInt(value);
    valueToString_abi_cxx11_(&local_68,pJVar4,value_01);
    pushValue(this,&local_68);
    break;
  case realValue:
    value_04 = Value::asDouble(value);
    valueToString_abi_cxx11_(&local_68,(Json *)pVVar5,value_04);
    pushValue(this,&local_68);
    break;
  case stringValue:
    pJVar4 = (Json *)Value::asCString(value);
    valueToQuotedString_abi_cxx11_(&local_68,pJVar4,value_00);
    pushValue(this,&local_68);
    break;
  case booleanValue:
    bVar2 = Value::asBool(value);
    pcVar6 = "false";
    if (bVar2) {
      pcVar6 = "true";
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,pcVar6,pcVar6 + ((ulong)bVar2 ^ 5));
    pushValue(this,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return;
    }
    goto LAB_0014ddce;
  case arrayValue:
    writeArrayValue(this,value);
    return;
  case objectValue:
    Value::getMemberNames_abi_cxx11_(&local_48,value);
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"{}","");
      pushValue(this,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) goto LAB_0014dd86;
    }
    else {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"{","");
      writeIndent(this);
      std::__ostream_insert<char,std::char_traits<char>>
                (this->document_,local_68._M_dataplus._M_p,local_68._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_append
                ((char *)&this->indentString_,(ulong)(this->indentation_)._M_dataplus._M_p);
      key = local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      do {
        pVVar5 = Value::operator[](value,key);
        writeCommentBeforeValue(this,pVVar5);
        valueToQuotedString_abi_cxx11_(&local_68,(Json *)(key->_M_dataplus)._M_p,value_02);
        writeIndent(this);
        std::__ostream_insert<char,std::char_traits<char>>
                  (this->document_,local_68._M_dataplus._M_p,local_68._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(this->document_," : ",3);
        writeValue(this,pVVar5);
        pbVar1 = local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        key = key + 1;
        if (key != local_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
          std::__ostream_insert<char,std::char_traits<char>>(this->document_,",",1);
        }
        writeCommentAfterValueOnSameLine(this,pVVar5);
      } while (key != pbVar1);
      unindent(this);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"}","");
      writeIndent(this);
      std::__ostream_insert<char,std::char_traits<char>>
                (this->document_,local_68._M_dataplus._M_p,local_68._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_0014dd86:
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  default:
    goto switchD_0014db51_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_0014ddce:
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
switchD_0014db51_default:
  return;
}

Assistant:

void 
StyledStreamWriter::writeValue( const Value &value )
{
   switch ( value.type() )
   {
   case nullValue:
      pushValue( "null" );
      break;
   case intValue:
      pushValue( valueToString( value.asLargestInt() ) );
      break;
   case uintValue:
      pushValue( valueToString( value.asLargestUInt() ) );
      break;
   case realValue:
      pushValue( valueToString( value.asDouble() ) );
      break;
   case stringValue:
      pushValue( valueToQuotedString( value.asCString() ) );
      break;
   case booleanValue:
      pushValue( valueToString( value.asBool() ) );
      break;
   case arrayValue:
      writeArrayValue( value);
      break;
   case objectValue:
      {
         Value::Members members( value.getMemberNames() );
         if ( members.empty() )
            pushValue( "{}" );
         else
         {
            writeWithIndent( "{" );
            indent();
            Value::Members::iterator it = members.begin();
            for (;;)
            {
               const std::string &name = *it;
               const Value &childValue = value[name];
               writeCommentBeforeValue( childValue );
               writeWithIndent( valueToQuotedString( name.c_str() ) );
               *document_ << " : ";
               writeValue( childValue );
               if ( ++it == members.end() )
               {
                  writeCommentAfterValueOnSameLine( childValue );
                  break;
               }
               *document_ << ",";
               writeCommentAfterValueOnSameLine( childValue );
            }
            unindent();
            writeWithIndent( "}" );
         }
      }
      break;
   }
}